

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void infixToPostfix(list *tokens,list *output,list *operators)

{
  _Bool _Var1;
  int iVar2;
  byte local_29;
  token *local_28;
  token *node;
  list *operators_local;
  list *output_local;
  list *tokens_local;
  
  local_28 = tokens->first;
  division_warning = false;
  trigonometric_warning = false;
  node = (token *)operators;
  operators_local = output;
  output_local = tokens;
  while( true ) {
    local_29 = 0;
    if (local_28 != (token *)0x0) {
      local_29 = parenthesis_warning ^ 0xff;
    }
    if ((local_29 & 1) == 0) break;
    if (local_28->opcode == OP_Closed_parenthesis) {
      migrateUntilParenthesis(operators_local,(list *)node);
    }
    else if ((local_28->opcode == OP_Open_parenthesis) ||
            (_Var1 = isFunction(local_28->opcode), _Var1)) {
      push((list **)&node,local_28);
    }
    else {
      _Var1 = isOperator(local_28->opcode);
      if (_Var1) {
        while (iVar2 = hasHigherEqualPrec(local_28,*(token **)&node->opcode), iVar2 != 0) {
          moveToken(&operators_local,(list **)&node);
        }
        push((list **)&node,local_28);
      }
      else {
        push(&operators_local,local_28);
      }
    }
    local_28 = local_28->next;
  }
  while (*(long *)&node->opcode != 0) {
    moveToken(&operators_local,(list **)&node);
  }
  return;
}

Assistant:

static void infixToPostfix(struct list *tokens,
                           struct list *output,
                           struct list *operators)
{
    struct token *node = tokens->first;

    division_warning = false;
    trigonometric_warning = false;

    while (node != NULL && !parenthesis_warning) {
        if (node->opcode == OP_Closed_parenthesis) {
            migrateUntilParenthesis(output, operators);
        } else if (node->opcode == OP_Open_parenthesis || isFunction(node->opcode)) {
            push(&operators, node);
        } else if (isOperator(node->opcode)) {
            while (hasHigherEqualPrec(node, operators->last)) {
                moveToken(&output, &operators);
            }

            push(&operators, node);
        } else {
            push(&output, node);
        }

        node = node->next;
    }

    while (operators->last != NULL) {
        moveToken(&output, &operators);
    }
}